

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

xmlBufPtr xmlBufCreateMem(xmlChar *mem,size_t size,int isStatic)

{
  xmlBufPtr pxVar1;
  xmlChar *__dest;
  
  if ((mem != (xmlChar *)0x0) && (pxVar1 = (xmlBufPtr)(*xmlMalloc)(0x38), pxVar1 != (xmlBufPtr)0x0))
  {
    if (isStatic == 0) {
      pxVar1->flags = 0;
      __dest = (xmlChar *)(*xmlMalloc)(size + 1);
      pxVar1->mem = __dest;
      if (__dest != (xmlChar *)0x0) {
        memcpy(__dest,mem,size);
        pxVar1->mem[size] = '\0';
        mem = pxVar1->mem;
        goto LAB_0012a707;
      }
    }
    else if (mem[size] == '\0') {
      pxVar1->flags = 4;
      pxVar1->mem = mem;
LAB_0012a707:
      pxVar1->use = size;
      pxVar1->size = size;
      pxVar1->maxSize = 0xfffffffffffffffe;
      pxVar1->content = mem;
      if (size < 0x7fffffff) {
        pxVar1->compat_size = (uint)size;
        pxVar1->compat_use = (uint)size;
        return pxVar1;
      }
      pxVar1->compat_use = 0x7fffffff;
      pxVar1->compat_size = 0x7fffffff;
      return pxVar1;
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlBufPtr)0x0;
}

Assistant:

xmlBufPtr
xmlBufCreateMem(const xmlChar *mem, size_t size, int isStatic) {
    xmlBufPtr ret;

    if (mem == NULL)
        return(NULL);

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
        return(NULL);

    if (isStatic) {
        /* Check that memory is zero-terminated */
        if (mem[size] != 0) {
            xmlFree(ret);
            return(NULL);
        }
        ret->flags = BUF_FLAG_STATIC;
        ret->mem = (xmlChar *) mem;
    } else {
        ret->flags = 0;
        ret->mem = xmlMalloc(size + 1);
        if (ret->mem == NULL) {
            xmlFree(ret);
            return(NULL);
        }
        memcpy(ret->mem, mem, size);
        ret->mem[size] = 0;
    }

    ret->use = size;
    ret->size = size;
    ret->maxSize = SIZE_MAX - 1;
    ret->content = ret->mem;

    UPDATE_COMPAT(ret);
    return(ret);
}